

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

void Saig_Bmc3ManStop(Gia_ManBmc_t *p)

{
  int local_58;
  int local_54;
  int local_40;
  int local_3c;
  uint local_34;
  uint local_2c;
  uint local_24;
  uint local_1c;
  int local_18;
  int nUsedVars;
  Gia_ManBmc_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    if (p->pSat == (sat_solver *)0x0) {
      local_18 = 0;
    }
    else {
      local_18 = sat_solver_count_usedvars(p->pSat);
    }
    if (p->pSat == (sat_solver *)0x0) {
      local_1c = 0;
    }
    else {
      local_1c = p->pSat->nLearntStart;
    }
    if (p->pSat == (sat_solver *)0x0) {
      local_24 = 0;
    }
    else {
      local_24 = p->pSat->nLearntDelta;
    }
    if (p->pSat == (sat_solver *)0x0) {
      local_2c = 0;
    }
    else {
      local_2c = p->pSat->nLearntRatio;
    }
    if (p->pSat == (sat_solver *)0x0) {
      local_34 = 0;
    }
    else {
      local_34 = p->pSat->nDBreduces;
    }
    if (p->pSat == (sat_solver *)0x0) {
      if (p->pSat3 == (bmcg_sat_solver *)0x0) {
        local_40 = satoko_varnum(p->pSat2);
      }
      else {
        local_40 = bmcg_sat_solver_varnum(p->pSat3);
      }
      local_3c = local_40;
    }
    else {
      local_3c = sat_solver_nvars(p->pSat);
    }
    if (p->pSat == (sat_solver *)0x0) {
      if (p->pSat3 == (bmcg_sat_solver *)0x0) {
        local_58 = satoko_varnum(p->pSat2);
      }
      else {
        local_58 = bmcg_sat_solver_varnum(p->pSat3);
      }
      local_54 = local_58;
    }
    else {
      local_54 = sat_solver_nvars(p->pSat);
    }
    Abc_Print(1,
              "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n"
              ,((double)local_18 * 100.0) / (double)local_54,(ulong)local_1c,(ulong)local_24,
              (ulong)local_2c,(ulong)local_34,local_3c,local_18);
    Abc_Print(1,"Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n",
              (ulong)(uint)p->nBufNum,(ulong)(uint)p->nDupNum,(ulong)(uint)p->nHashHit,
              (ulong)(uint)p->nHashMiss,p->nUniProps);
  }
  if (p->vCexes != (Vec_Ptr_t *)0x0) {
    if (p->pAig->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->pAig->vSeqModelVec == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc3.c"
                    ,0x332,"void Saig_Bmc3ManStop(Gia_ManBmc_t *)");
    }
    p->pAig->vSeqModelVec = p->vCexes;
    p->vCexes = (Vec_Ptr_t *)0x0;
  }
  Vec_WecFree(p->vVisited);
  Vec_IntFree(p->vMapping);
  Vec_IntFree(p->vMapRefs);
  Vec_IntFree(p->vId2Num);
  Vec_VecFree((Vec_Vec_t *)p->vId2Var);
  Vec_PtrFreeFree(p->vTerInfo);
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  if (p->pSat2 != (satoko_t *)0x0) {
    satoko_destroy(p->pSat2);
  }
  if (p->pSat3 != (bmcg_sat_solver *)0x0) {
    bmcg_sat_solver_stop(p->pSat3);
  }
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  Vec_IntFree(p->vData);
  Hsh_IntManStop(p->vHash);
  Vec_IntFree(p->vId2Lit);
  if (p->pSopSizes != (char *)0x0) {
    free(p->pSopSizes);
    p->pSopSizes = (char *)0x0;
  }
  if (p->pSops[1] != (char *)0x0) {
    free(p->pSops[1]);
    p->pSops[1] = (char *)0x0;
  }
  if (p->pSops != (char **)0x0) {
    free(p->pSops);
    p->pSops = (char **)0x0;
  }
  if (p != (Gia_ManBmc_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Saig_Bmc3ManStop( Gia_ManBmc_t * p )
{
    if ( p->pPars->fVerbose )
    {
        int nUsedVars = p->pSat ? sat_solver_count_usedvars(p->pSat) : 0;
        Abc_Print( 1, "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n", 
            p->pSat ? p->pSat->nLearntStart     : 0, 
            p->pSat ? p->pSat->nLearntDelta     : 0, 
            p->pSat ? p->pSat->nLearntRatio     : 0, 
            p->pSat ? p->pSat->nDBreduces       : 0, 
            p->pSat ? sat_solver_nvars(p->pSat) : p->pSat3 ? bmcg_sat_solver_varnum(p->pSat3) : satoko_varnum(p->pSat2), 
            nUsedVars, 
            100.0*nUsedVars/(p->pSat ? sat_solver_nvars(p->pSat) : p->pSat3 ? bmcg_sat_solver_varnum(p->pSat3) : satoko_varnum(p->pSat2)) );
        Abc_Print( 1, "Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n", 
            p->nBufNum, p->nDupNum, p->nHashHit, p->nHashMiss, p->nUniProps );
    }
//    Aig_ManCleanMarkA( p->pAig );
    if ( p->vCexes )
    {
        assert( p->pAig->vSeqModelVec == NULL );
        p->pAig->vSeqModelVec = p->vCexes;
        p->vCexes = NULL;
    }
//    Vec_PtrFreeFree( p->vCexes );
    Vec_WecFree( p->vVisited );
    Vec_IntFree( p->vMapping );
    Vec_IntFree( p->vMapRefs );
//    Vec_VecFree( p->vSects );
    Vec_IntFree( p->vId2Num );
    Vec_VecFree( (Vec_Vec_t *)p->vId2Var );
    Vec_PtrFreeFree( p->vTerInfo );
    if ( p->pSat )  sat_solver_delete( p->pSat );
    if ( p->pSat2 ) satoko_destroy( p->pSat2 );
    if ( p->pSat3 ) bmcg_sat_solver_stop( p->pSat3 );
    ABC_FREE( p->pTime4Outs );
    Vec_IntFree( p->vData );
    Hsh_IntManStop( p->vHash );
    Vec_IntFree( p->vId2Lit );
    ABC_FREE( p->pSopSizes );
    ABC_FREE( p->pSops[1] );
    ABC_FREE( p->pSops );
    ABC_FREE( p );
}